

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O0

void __thiscall HighsMipAnalysis::mipTimerStart(HighsMipAnalysis *this,HighsInt mip_clock)

{
  const_reference pvVar1;
  reference pvVar2;
  undefined8 uVar3;
  int in_ESI;
  long in_RDI;
  string clock_name;
  HighsInt highs_timer_clock;
  HighsTimer *in_stack_ffffffffffffffc0;
  string local_30 [32];
  int local_10;
  
  if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)in_ESI);
    local_10 = *pvVar1;
    if (local_10 == -4) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(*(long *)(in_RDI + 0x28) + 0x60),0xfffffffffffffffc);
      std::__cxx11::string::string(local_30,(string *)pvVar2);
      uVar3 = std::__cxx11::string::c_str();
      printf("MipTimer: starting clock %d: %s\n",0xfffffffc,uVar3);
      std::__cxx11::string::~string(local_30);
    }
    HighsTimer::start(in_stack_ffffffffffffffc0,(HighsInt)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void HighsMipAnalysis::mipTimerStart(const HighsInt mip_clock
                                     // , const HighsInt thread_id
) const {
  if (!analyse_mip_time) return;
  HighsInt highs_timer_clock = mip_clocks.clock_[mip_clock];
  if (highs_timer_clock == check_mip_clock) {
    std::string clock_name =
        mip_clocks.timer_pointer_->clock_names[check_mip_clock];
    printf("MipTimer: starting clock %d: %s\n", int(check_mip_clock),
           clock_name.c_str());
  }
  mip_clocks.timer_pointer_->start(highs_timer_clock);
}